

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::finalize(CommonCore *this,LocalFederateId federateID)

{
  string_view message;
  bool bVar1;
  FederateStates FVar2;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  ActionMessage bye_1;
  ActionMessage bye;
  BrokerState cbrokerState;
  FederateState *fed;
  ActionMessage *in_stack_fffffffffffffe18;
  ActionMessage *message_00;
  BrokerBase *in_stack_fffffffffffffe20;
  FederateState *this_00;
  undefined4 in_stack_fffffffffffffe38;
  action_t in_stack_fffffffffffffe3c;
  ActionMessage *in_stack_fffffffffffffe40;
  CommonCore *in_stack_fffffffffffffe58;
  LocalFederateId in_stack_fffffffffffffe64;
  GlobalFederateId local_e8;
  undefined4 local_e0;
  BrokerState local_32;
  undefined8 local_18;
  
  local_18 = getFederateAt(in_stack_fffffffffffffe58,in_stack_fffffffffffffe64);
  if ((FederateState *)local_18 != (FederateState *)0x0) {
    local_32 = BrokerBase::getBrokerState((BrokerBase *)0x54b0e3);
    if ((ushort)(local_32 + CONNECTING) < 4) {
      this_00 = (FederateState *)&stack0xffffffffffffff10;
      ActionMessage::ActionMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      local_e8 = std::atomic<helics::GlobalFederateId>::load
                           ((atomic<helics::GlobalFederateId> *)(local_18 + 0x2c),seq_cst);
      local_e0 = local_e8;
      BrokerBase::addActionMessage((BrokerBase *)this_00,in_stack_fffffffffffffe18);
      FederateState::addAction(this_00,in_stack_fffffffffffffe18);
      ActionMessage::~ActionMessage((ActionMessage *)this_00);
    }
    else {
      message_00 = (ActionMessage *)&stack0xfffffffffffffe40;
      ActionMessage::ActionMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      std::atomic<helics::GlobalFederateId>::load
                ((atomic<helics::GlobalFederateId> *)(local_18 + 0x2c),seq_cst);
      BrokerBase::addActionMessage(in_stack_fffffffffffffe20,message_00);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe20);
    }
    bVar1 = FederateState::isCallbackFederate((FederateState *)local_18);
    if (bVar1) {
      FVar2 = FederateState::getState((FederateState *)0x54b253);
      if (FVar2 == CREATED) {
        FederateState::finalize
                  ((FederateState *)
                   bye_1.stringData.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      FederateState::finalize
                ((FederateState *)
                 bye_1.stringData.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    return;
  }
  __str = (char *)__cxa_allocate_exception(0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,__str);
  message._M_len._4_4_ = in_stack_fffffffffffffe3c;
  message._M_len._0_4_ = in_stack_fffffffffffffe38;
  message._M_str = (char *)in_stack_fffffffffffffe40;
  InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_RDI,message);
  __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
}

Assistant:

void CommonCore::finalize(LocalFederateId federateID)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid finalize"));
    }

    auto cbrokerState = getBrokerState();
    switch (cbrokerState) {
        case BrokerState::TERMINATED:
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage bye(CMD_STOP);
            bye.source_id = fed->global_id.load();
            bye.dest_id = bye.source_id;
            addActionMessage(bye);
            fed->addAction(bye);
        } break;
        default: {
            ActionMessage bye(CMD_DISCONNECT);
            bye.source_id = fed->global_id.load();
            bye.dest_id = bye.source_id;
            addActionMessage(bye);
        } break;
    }
    if (fed->isCallbackFederate()) {
        if (fed->getState() == FederateStates::CREATED) {
            fed->finalize();
        }
        // else just let the normal callback operation take place
    } else {
        fed->finalize();
    }
}